

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DisableIffSyntax *node;
  DisableIffSyntax *alloc;
  PropertySpecSyntax *pPVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  TimingControlSyntax *in_stack_ffffffffffffffd0;
  DisableIffSyntax *this;
  
  if (*(long *)(__fn + 0x18) == 0) {
    node = (DisableIffSyntax *)0x0;
  }
  else {
    node = (DisableIffSyntax *)
           deepClone<slang::syntax::TimingControlSyntax>
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (*(long *)(__fn + 0x20) == 0) {
    alloc = (DisableIffSyntax *)0x0;
  }
  else {
    alloc = deepClone<slang::syntax::DisableIffSyntax>(node,in_stack_ffffffffffffffc8);
  }
  this = alloc;
  not_null<slang::syntax::PropertyExprSyntax_*>::operator*
            ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7a4005);
  deepClone<slang::syntax::PropertyExprSyntax>((PropertyExprSyntax *)node,(BumpAllocator *)alloc);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PropertySpecSyntax,slang::syntax::TimingControlSyntax*,slang::syntax::DisableIffSyntax*,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)this,(TimingControlSyntax **)__child_stack,
                      (DisableIffSyntax **)node,(PropertyExprSyntax *)alloc);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PropertySpecSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PropertySpecSyntax>(
        node.clocking ? deepClone(*node.clocking, alloc) : nullptr,
        node.disable ? deepClone(*node.disable, alloc) : nullptr,
        *deepClone<PropertyExprSyntax>(*node.expr, alloc)
    );
}